

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall QtMWidgets::DateTimePicker::wheelEvent(DateTimePicker *this,QWheelEvent *event)

{
  bool bVar1;
  int iVar2;
  DateTimePickerPrivate *pDVar3;
  DateTimePickerPrivate *pDVar4;
  DateTimePickerPrivate *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *__addr;
  int iVar5;
  QPointF *pos;
  QPointF local_30;
  QPoint local_20;
  QPoint numDegrees;
  QWheelEvent *event_local;
  DateTimePicker *this_local;
  
  numDegrees = (QPoint)event;
  local_20 = QWheelEvent::angleDelta(event);
  iVar5 = (int)event;
  bVar1 = QPoint::isNull(&local_20);
  __addr = extraout_RDX;
  if (!bVar1) {
    pDVar3 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    local_30 = QSinglePointEvent::position((QSinglePointEvent *)numDegrees);
    pos = &local_30;
    DateTimePickerPrivate::findMovableSection(pDVar3,pos);
    iVar5 = (int)pos;
    iVar2 = QPoint::y(&local_20);
    if (iVar2 < 1) {
      iVar2 = QPoint::y(&local_20);
      if (iVar2 < 0) {
        pDVar3 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
                 ::operator->(&this->d);
        pDVar4 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
                 ::operator->(&this->d);
        iVar5 = pDVar4->itemHeight;
        in_RCX = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
                 ::operator->(&this->d);
        iVar5 = -(iVar5 + in_RCX->itemTopMargin);
        DateTimePickerPrivate::updateOffset(pDVar3,iVar5);
      }
    }
    else {
      pDVar3 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
               ::operator->(&this->d);
      pDVar4 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
               ::operator->(&this->d);
      iVar5 = pDVar4->itemHeight;
      pDVar4 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
               ::operator->(&this->d);
      iVar5 = iVar5 + pDVar4->itemTopMargin;
      DateTimePickerPrivate::updateOffset(pDVar3,iVar5);
    }
    iVar2 = QPoint::y(&local_20);
    __addr = extraout_RDX_00;
    if (iVar2 != 0) {
      pDVar3 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
               ::operator->(&this->d);
      DateTimePickerPrivate::normalizeOffsets(pDVar3);
      pDVar3 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
               ::operator->(&this->d);
      DateTimePickerPrivate::clearOffset(pDVar3);
      pDVar3 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
               ::operator->(&this->d);
      DateTimePickerPrivate::updateDaysIfNeeded(pDVar3);
      pDVar3 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
               ::operator->(&this->d);
      DateTimePickerPrivate::updateCurrentDateTime(pDVar3);
      pDVar3 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
               ::operator->(&this->d);
      pDVar3->movableSection = -1;
      QWidget::update();
      __addr = extraout_RDX_01;
    }
  }
  QEvent::accept((QEvent *)numDegrees,iVar5,__addr,(socklen_t *)in_RCX);
  return;
}

Assistant:

void
DateTimePicker::wheelEvent( QWheelEvent * event )
{
	QPoint numDegrees = event->angleDelta();

	if( !numDegrees.isNull() )
	{
		d->findMovableSection( event->position() );

		if( numDegrees.y() > 0 )
			d->updateOffset( d->itemHeight + d->itemTopMargin );
		else if( numDegrees.y() < 0 )
			d->updateOffset( -( d->itemHeight + d->itemTopMargin ) );

		if( numDegrees.y() != 0 )
		{
			d->normalizeOffsets();
			d->clearOffset();
			d->updateDaysIfNeeded();
			d->updateCurrentDateTime();

			d->movableSection = -1;

			update();
		}
	}

	event->accept();
}